

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpressionResult.cpp
# Opt level: O3

void Js::JavascriptRegularExpressionResult::SetMatch(JavascriptArray *arr,GroupInfo match)

{
  code *pcVar1;
  undefined4 propertyId;
  bool bVar2;
  undefined4 *puVar3;
  uint64 uVar4;
  uint64 uVar5;
  Var value;
  double value_00;
  
  bVar2 = Is(arr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpressionResult.cpp"
                                ,0x37,"(JavascriptRegularExpressionResult::Is(arr))",
                                "JavascriptRegularExpressionResult::Is(arr)");
    if (!bVar2) goto LAB_00d09430;
    *puVar3 = 0;
  }
  if (0xfffffffeffffffff < (ulong)match) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpressionResult.cpp"
                                ,0x38,"(!match.IsUndefined())","!match.IsUndefined()");
    if (!bVar2) goto LAB_00d09430;
    *puVar3 = 0;
  }
  propertyId = BuiltInPropertyRecords::index._8_4_;
  if ((int)match.offset < 0) {
    value_00 = (double)((ulong)match & 0xffffffff);
    uVar4 = NumberUtilities::ToSpecial(value_00);
    bVar2 = NumberUtilities::IsNan(value_00);
    if (bVar2) {
      uVar5 = NumberUtilities::ToSpecial(value_00);
      if (uVar5 != 0xfff8000000000000) {
        uVar5 = NumberUtilities::ToSpecial(value_00);
        if (uVar5 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) {
LAB_00d09430:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar3 = 0;
        }
      }
    }
    value = (Var)(uVar4 ^ 0xfffc000000000000);
  }
  else {
    value = (Var)((ulong)(match.offset & 0x7fffffff) | 0x1000000000000);
  }
  DynamicObject::SetSlot((DynamicObject *)arr,propertyId,false,1,value);
  return;
}

Assistant:

void JavascriptRegularExpressionResult::SetMatch(JavascriptArray* arr, const UnifiedRegex::GroupInfo match)
    {
        Assert(JavascriptRegularExpressionResult::Is(arr));
        Assert(!match.IsUndefined());

        ScriptContext* scriptContext = arr->GetScriptContext();
        arr->SetSlot(SetSlotArguments(BuiltInPropertyRecords::index.propertyRecord.GetPropertyId(), IndexIndex, JavascriptNumber::ToVar(match.offset, scriptContext)));
    }